

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_tests.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  SingletonDatabase *pSVar2;
  ostream *poVar3;
  allocator<char> local_31;
  string local_30 [32];
  
  pSVar2 = SingletonDatabase::get();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"Tokyo",&local_31);
  iVar1 = (**(pSVar2->super_IDatabase)._vptr_IDatabase)(pSVar2,local_30);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
	//auto* nsd{NaiveSingletonDatabase::get_instance()};
	//NaiveSingletonDatabase::destroy_instance();

	auto& sd{SingletonDatabase::get()};
	std::cout << sd.get_population("Tokyo") << std::endl;

	return 0;
}